

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.h
# Opt level: O0

double __thiscall libDAI::TFactor<double>::log(TFactor<double> *this,double __x)

{
  double __x_00;
  double extraout_XMM0_Qa;
  TFactor<double> *l;
  TFactor<double> *this_00;
  TFactor<double> *in_stack_ffffffffffffffc0;
  
  this_00 = this;
  TFactor(in_stack_ffffffffffffffc0);
  VarSet::operator=(&this_00->_vs,&this->_vs);
  TProb<double>::log((TProb<double> *)&stack0xffffffffffffffc0,__x_00);
  TProb<double>::operator=((TProb<double> *)this_00,(TProb<double> *)this);
  TProb<double>::~TProb((TProb<double> *)0xba8763);
  return extraout_XMM0_Qa;
}

Assistant:

TFactor<T> log() const {
                TFactor<T> l; 
                l._vs = _vs; 
                l._p = _p.log(); 
                return l; 
            }